

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O2

Abc_Obj_t * Abc_AigMiter_rec(Abc_Aig_t *pMan,Abc_Obj_t **ppObjs,int nObjs)

{
  int nObjs_00;
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *p1;
  
  if (nObjs == 1) {
    return *ppObjs;
  }
  nObjs_00 = nObjs / 2;
  pAVar1 = Abc_AigMiter_rec(pMan,ppObjs,nObjs_00);
  p1 = Abc_AigMiter_rec(pMan,ppObjs + nObjs_00,nObjs - nObjs_00);
  pAVar1 = Abc_AigOr(pMan,pAVar1,p1);
  return pAVar1;
}

Assistant:

Abc_Obj_t * Abc_AigMiter_rec( Abc_Aig_t * pMan, Abc_Obj_t ** ppObjs, int nObjs )
{
    Abc_Obj_t * pObj1, * pObj2;
    if ( nObjs == 1 )
        return ppObjs[0];
    pObj1 = Abc_AigMiter_rec( pMan, ppObjs,           nObjs/2 );
    pObj2 = Abc_AigMiter_rec( pMan, ppObjs + nObjs/2, nObjs - nObjs/2 );
    return Abc_AigOr( pMan, pObj1, pObj2 );
}